

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

char * gl4cts::TextureViewUtilities::getErrorCodeString(GLint error_code)

{
  switch(error_code) {
  case 0x500:
    return "GL_INVALID_ENUM";
  case 0x501:
    return "GL_INVALID_VALUE";
  case 0x502:
    return "GL_INVALID_OPERATION";
  case 0x503:
    return "GL_STACK_OVERFLOW";
  case 0x504:
    return "GL_STACK_UNDERFLOW";
  case 0x505:
    return "GL_OUT_OF_MEMORY";
  case 0x506:
    return "GL_INVALID_FRAMEBUFFER_OPERATION";
  }
  if (error_code != 0) {
    return "[?]";
  }
  return "GL_NO_ERROR";
}

Assistant:

const char* TextureViewUtilities::getErrorCodeString(const glw::GLint error_code)
{
	switch (error_code)
	{
	case GL_INVALID_ENUM:
		return "GL_INVALID_ENUM";
	case GL_INVALID_FRAMEBUFFER_OPERATION:
		return "GL_INVALID_FRAMEBUFFER_OPERATION";
	case GL_INVALID_OPERATION:
		return "GL_INVALID_OPERATION";
	case GL_INVALID_VALUE:
		return "GL_INVALID_VALUE";
	case GL_NO_ERROR:
		return "GL_NO_ERROR";
	case GL_OUT_OF_MEMORY:
		return "GL_OUT_OF_MEMORY";
	case GL_STACK_OVERFLOW:
		return "GL_STACK_OVERFLOW";
	case GL_STACK_UNDERFLOW:
		return "GL_STACK_UNDERFLOW";
	default:
		return "[?]";
	}
}